

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O1

bool __thiscall Js::DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(DynamicTypeHandler *this)

{
  Type TVar1;
  
  TVar1 = this->offsetOfInlineSlots;
  if (TVar1 == 0x10) {
    VerifyObjectHeaderInlinedTypeHandler(this);
  }
  return TVar1 == 0x10;
}

Assistant:

bool DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler() const
    {
        const bool isObjectHeaderInlined = IsObjectHeaderInlinedTypeHandlerUnchecked();
        if(isObjectHeaderInlined)
        {
            VerifyObjectHeaderInlinedTypeHandler();
        }
        return isObjectHeaderInlined;
    }